

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QSqlDatabase __thiscall
QHash<QString,_QSqlDatabase>::value(QHash<QString,_QSqlDatabase> *this,QString *key)

{
  Data<QHashPrivate::Node<QString,_QSqlDatabase>_> *this_00;
  Node<QString,_QSqlDatabase> *pNVar1;
  QSqlDatabase *other;
  QString *in_RDX;
  
  this_00 = (Data<QHashPrivate::Node<QString,_QSqlDatabase>_> *)(key->d).d;
  if (this_00 != (Data<QHashPrivate::Node<QString,_QSqlDatabase>_> *)0x0) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QSqlDatabase>_>::findNode<QString>
                       (this_00,in_RDX);
    if (pNVar1 != (Node<QString,_QSqlDatabase> *)0x0) {
      other = &pNVar1->value;
      goto LAB_0011a775;
    }
  }
  other = (QSqlDatabase *)0x0;
LAB_0011a775:
  if (other == (QSqlDatabase *)0x0) {
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)this);
  }
  else {
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)this,other);
  }
  return (QSqlDatabase)(QSqlDatabasePrivate *)this;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }